

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O1

double cosd(double angle)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  
  dVar3 = fmod(angle,90.0);
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    dVar3 = floor(angle / 90.0 + 0.5);
    uVar1 = (uint)dVar3;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    return *(double *)(&DAT_0021bb10 + (ulong)(uVar2 & 3) * 8);
  }
  dVar3 = cos(angle * 0.017453292519943295);
  return dVar3;
}

Assistant:

double cosd(double angle) {
    int i;

    if (fmod(angle, 90.0) == 0.0) {
        i = abs((int) floor(angle / 90.0 + 0.5)) % 4;
        switch (i) {
        case 0:
            return 1.0;
        case 1:
            return 0.0;
        case 2:
            return -1.0;
        case 3:
            return 0.0;
        }
    }

    return cos(angle * D2R);
}